

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.c
# Opt level: O0

Real * ZBufferGetDepth(Real *__return_storage_ptr__,ZBuffer *zbuffer,uint16_t x,uint16_t y)

{
  int iVar1;
  undefined4 extraout_var;
  Real depth;
  uint16_t y_local;
  uint16_t x_local;
  ZBuffer *zbuffer_local;
  Real *pRVar2;
  
  if (((ushort)zbuffer < *(ushort *)__return_storage_ptr__) &&
     (x < *(ushort *)((long)__return_storage_ptr__ + 2))) {
    pRVar2 = *(Real **)((long)__return_storage_ptr__ + 8);
  }
  else {
    iVar1 = fprintf(_stderr,"%s: Invalid depth indices (x:%d<%d, y:%d<%d)\n","ZBufferGetDepth",
                    (ulong)zbuffer & 0xffff,(ulong)*(ushort *)__return_storage_ptr__,(ulong)x,
                    (uint)*(ushort *)((long)__return_storage_ptr__ + 2));
    pRVar2 = (Real *)CONCAT44(extraout_var,iVar1);
  }
  return pRVar2;
}

Assistant:

Real ZBufferGetDepth(const ZBuffer *zbuffer, uint16_t x, uint16_t y) {
  if (zbuffer->imageWidth <= x || zbuffer->imageHeight <= y) {
#ifndef NDEBUG
    fprintf(stderr, "%s: Invalid depth indices (x:%d<%d, y:%d<%d)\n", __FUNCTION_NAME__, x, zbuffer->imageWidth, y, zbuffer->imageHeight);
#endif
    return DBL_MIN;
  }
  Real depth;
  depth = zbuffer->depths[x + zbuffer->imageHeight * y];
  return depth;
}